

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)4,(moira::Mode)2,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  Syntax SVar1;
  int iVar2;
  u64 value;
  char cVar3;
  char *pcVar4;
  long lVar5;
  Ea<(moira::Mode)2,_4> dst;
  u32 local_24;
  ushort local_20;
  
  local_20 = op & 7;
  local_24 = *addr;
  value = 8;
  if ((op & 0xe00) != 0) {
    value = (ulong)((byte)(op >> 9) & 7);
  }
  s = &str->ptr;
  if (str->style->syntax == MUSASHI) {
    cVar3 = 'a';
    lVar5 = 0;
    do {
      pcVar4 = *s;
      *s = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = "addq"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pcVar4 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar4 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar4 = '.';
      pcVar4 = *s;
      *s = pcVar4 + 1;
    }
    *pcVar4 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = *s;
      *s = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = *s;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar2);
    }
    str->ptr = pcVar4 + 1;
    *pcVar4 = '#';
    sprintd(s,value);
  }
  else {
    cVar3 = 'a';
    lVar5 = 0;
    do {
      pcVar4 = *s;
      *s = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = "addq"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pcVar4 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar4 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar4 = '.';
      pcVar4 = *s;
      *s = pcVar4 + 1;
    }
    *pcVar4 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = *s;
      *s = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = *s;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar2);
    }
    str->ptr = pcVar4 + 1;
    *pcVar4 = '#';
    StrWriter::operator<<(str,(Int)(i32)value);
  }
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar4 = *s;
    *s = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_4> *)&local_24);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src =          ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << dst;
    }
}